

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CloseCurrentPopup(void)

{
  int iVar1;
  ImGuiPopupData *pIVar2;
  ImGuiContext_conflict1 *pIVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  uint remaining;
  
  pIVar3 = GImGui;
  iVar1 = (GImGui->BeginPopupStack).Size;
  if ((0 < iVar1) && (iVar1 <= (GImGui->OpenPopupStack).Size)) {
    uVar4 = iVar1 - 1;
    pIVar2 = (GImGui->OpenPopupStack).Data;
    if ((GImGui->BeginPopupStack).Data[uVar4].PopupId == pIVar2[uVar4].PopupId) {
      remaining = 0;
      if (uVar4 != 0) {
        pIVar5 = pIVar2[uVar4].Window;
        ppIVar6 = &pIVar2[iVar1 - 2].Window;
        do {
          remaining = uVar4;
          if (((pIVar5 == (ImGuiWindow *)0x0) || ((pIVar5->Flags & 0x10000000) == 0)) ||
             ((pIVar5 = *ppIVar6, pIVar5 != (ImGuiWindow *)0x0 && ((pIVar5->Flags & 0x8000000) != 0)
              ))) break;
          uVar4 = uVar4 - 1;
          ppIVar6 = ppIVar6 + -6;
          remaining = 0;
        } while (uVar4 != 0);
      }
      ClosePopupToLevel(remaining,true);
      if (pIVar3->NavWindow != (ImGuiWindow_conflict *)0x0) {
        (pIVar3->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window == NULL || !(parent_popup_window->Flags & ImGuiWindowFlags_Modal))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    IMGUI_DEBUG_LOG_POPUP("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}